

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::enterDirectory(QFileDialogPrivate *this,QModelIndex *index)

{
  QWidget *this_00;
  QAbstractItemModel *pQVar1;
  char cVar2;
  FileMode FVar3;
  int iVar4;
  uint uVar5;
  QStyle *pQVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  if ((index->m).ptr == (QAbstractItemModel *)this->proxyModel) {
    mapToSource((QModelIndex *)&local_78,this,index);
  }
  else {
    local_68.ptr = (index->m).ptr;
    local_78 = *(undefined1 **)index;
    puStack_70 = (undefined1 *)index->i;
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d._0_4_ = 0xaaaaaaaa;
  local_98.d._4_4_ = 0xaaaaaaaa;
  local_98.ptr._0_4_ = 0xaaaaaaaa;
  local_98.ptr._4_4_ = 0xaaaaaaaa;
  QModelIndex::data((QVariant *)&local_58,(QModelIndex *)&local_78,0x101);
  ::QVariant::toString();
  ::QVariant::~QVariant((QVariant *)&local_58);
  if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
    cVar2 = QFileSystemModel::isDir((QModelIndex *)this->model);
    if (cVar2 == '\0') {
      pQVar6 = QWidget::style(this_00);
      iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))
                        (pQVar6,0x3d,0,((this->qFileDialogUi).d)->treeView,0);
      if (iVar4 != 0) {
        FVar3 = QFileDialog::fileMode((QFileDialog *)this_00);
        if (FVar3 == ExistingFiles) {
          uVar5 = QGuiApplication::keyboardModifiers();
          if ((uVar5 >> 0x1a & 1) != 0) goto LAB_0049a34f;
        }
      }
      pQVar1 = (index->m).ptr;
      uVar7 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index);
      if ((uVar7 & 0x20) != 0) {
        (**(code **)(*(long *)this_00 + 0x1b8))(this_00);
      }
      goto LAB_0049a34f;
    }
  }
  FVar3 = QFileDialog::fileMode((QFileDialog *)this_00);
  QFileDialog::setDirectory((QFileDialog *)this_00,(QString *)&local_98);
  QFileDialog::directoryEntered((QFileDialog *)this_00,(QString *)&local_98);
  if (FVar3 == Directory) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    QLineEdit::setText(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,
                       (QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QLineEdit::clear(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  }
LAB_0049a34f:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::enterDirectory(const QModelIndex &index)
{
    Q_Q(QFileDialog);
    // My Computer or a directory
    QModelIndex sourceIndex = index.model() == proxyModel ? mapToSource(index) : index;
    QString path = sourceIndex.data(QFileSystemModel::FilePathRole).toString();
    if (path.isEmpty() || model->isDir(sourceIndex)) {
        const QFileDialog::FileMode fileMode = q->fileMode();
        q->setDirectory(path);
        emit q->directoryEntered(path);
        if (fileMode == QFileDialog::Directory) {
            // ### find out why you have to do both of these.
            lineEdit()->setText(QString());
            lineEdit()->clear();
        }
    } else {
        // Do not accept when shift-clicking to multi-select a file in environments with single-click-activation (KDE)
        if ((!q->style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, qFileDialogUi->treeView)
             || q->fileMode() != QFileDialog::ExistingFiles || !(QGuiApplication::keyboardModifiers() & Qt::CTRL))
            && index.model()->flags(index) & Qt::ItemIsEnabled) {
            q->accept();
        }
    }
}